

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O1

path * __thiscall ghc::filesystem::path::operator+=(path *this,value_type *x)

{
  size_t sVar1;
  long *plVar2;
  long *local_40 [2];
  long local_30 [2];
  
  sVar1 = strlen(x);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,x,x + sVar1);
  postprocess_path_with_format((path *)local_40,(format)x);
  plVar2 = local_40[0];
  std::__cxx11::string::_M_append((char *)this,(ulong)local_40[0]);
  postprocess_path_with_format(this,(format)plVar2);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return this;
}

Assistant:

GHC_INLINE path& path::operator+=(const value_type* x)
{
#ifdef GHC_WITH_STRING_VIEW
    basic_string_view<value_type> part(x);
#else
    string_type part(x);
#endif
    return concat(part);
}